

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BalanceFunction.cpp
# Opt level: O0

bool __thiscall
BalanceFunction::check_same_particle(BalanceFunction *this,particle_info *lhs,particle_info *rhs)

{
  int *in_RDX;
  int *in_RSI;
  int in_EDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double tol;
  bool flag;
  bool local_19;
  
  local_19 = false;
  if ((((*in_RSI == *in_RDX) && (std::abs(in_EDI), extraout_XMM0_Qa < 1e-15)) &&
      (std::abs(in_EDI), extraout_XMM0_Qa_00 < 1e-15)) &&
     (((std::abs(in_EDI), extraout_XMM0_Qa_01 < 1e-15 &&
       (std::abs(in_EDI), extraout_XMM0_Qa_02 < 1e-15)) &&
      (std::abs(in_EDI), extraout_XMM0_Qa_03 < 1e-15)))) {
    std::abs(in_EDI);
    local_19 = extraout_XMM0_Qa_04 < 1e-15;
  }
  return local_19;
}

Assistant:

bool BalanceFunction::check_same_particle(
    const particle_info& lhs, const particle_info& rhs) {
    bool flag = false;
    const double tol = 1e-15;
    if (lhs.monval == rhs.monval) {
        if (std::abs(lhs.E - rhs.E) < tol) {
            if (std::abs(lhs.px - rhs.px) < tol) {
                if (std::abs(lhs.py - rhs.py) < tol) {
                    if (std::abs(lhs.t - rhs.t) < tol) {
                        if (std::abs(lhs.x - rhs.x) < tol) {
                            if (std::abs(lhs.y - rhs.y) < tol) {
                                flag = true;
                            }
                        }
                    }
                }
            }
        }
    }
    return (flag);
}